

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::RecordStrConstant
          (FunctionBody *this,RegSlot location,LPCOLESTR psz,uint32 cch,bool forcePropertyString)

{
  ScriptContext *this_00;
  PropertyRecord *in_RAX;
  PropertyString *var;
  undefined3 in_register_00000081;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  
  this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
  local_38 = in_RAX;
  if (CONCAT31(in_register_00000081,forcePropertyString) == 0) {
    ScriptContext::FindPropertyRecord(this_00,psz,cch,&local_38);
  }
  else {
    ScriptContext::GetOrAddPropertyRecord(this_00,psz,cch,&local_38);
  }
  if (local_38 == (PropertyRecord *)0x0) {
    var = (PropertyString *)JavascriptString::NewCopyBuffer(psz,cch,this_00);
  }
  else {
    var = ScriptContext::GetPropertyString(this_00,local_38->pid);
  }
  RecordConstant(this,location,var);
  return;
}

Assistant:

void FunctionBody::RecordStrConstant(RegSlot location, LPCOLESTR psz, uint32 cch, bool forcePropertyString)
    {
        ScriptContext *scriptContext = this->GetScriptContext();
        PropertyRecord const * propertyRecord;
        if (forcePropertyString)
        {
            scriptContext->GetOrAddPropertyRecord(psz, cch, &propertyRecord);
        }
        else
        {
            scriptContext->FindPropertyRecord(psz, cch, &propertyRecord);
        }
        Var str;
        if (propertyRecord == nullptr)
        {
            str = JavascriptString::NewCopyBuffer(psz, cch, scriptContext);
        }
        else
        {
            // If a particular string constant already has a propertyId, just create a property string for it
            // as it might be likely that it is used for a property lookup
            str = scriptContext->GetPropertyString(propertyRecord->GetPropertyId());
        }
        this->RecordConstant(location, str);
    }